

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall cs_impl::any::make<cs::numeric,int>(any *this,int *args)

{
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_00256658 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x30);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<std::__cxx11::string_const*>::allocator + DAT_00256658 * 8);
    DAT_00256658 = DAT_00256658 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0024cd78;
  *(undefined1 *)&pbVar1[4]._vptr_baseHolder = 1;
  pbVar1[2]._vptr_baseHolder = (_func_int **)(long)*args;
  if ((DAT_00258550 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_00258550];
    DAT_00258550 = DAT_00258550 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}